

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void empty_queue(event_path_data evp,queue_ptr queue)

{
  event_path_data p_Var1;
  queue_item *pqVar2;
  event_path_data __ptr;
  queue_item *tmp;
  
  p_Var1 = (event_path_data)queue->queue_head;
  while ((__ptr = p_Var1, __ptr != (event_path_data)0x0 && (queue->queue_tail != (queue_item *)0x0))
        ) {
    return_event(evp,*(event_item **)__ptr);
    if (queue->queue_head == queue->queue_tail) {
      queue->queue_tail = (queue_item *)0x0;
      pqVar2 = (queue_item *)0x0;
    }
    else {
      pqVar2 = queue->queue_head->next;
    }
    queue->queue_head = pqVar2;
    free(__ptr);
    p_Var1 = (event_path_data)queue->queue_head;
    evp = __ptr;
  }
  return;
}

Assistant:

static void
empty_queue(event_path_data evp, queue_ptr queue)
{
    while(queue->queue_head != NULL && queue->queue_tail != NULL) {
	queue_item *tmp = queue->queue_head;
	return_event(evp, queue->queue_head->item);
        if(queue->queue_head == queue->queue_tail) {
	    queue->queue_head = NULL;
	    queue->queue_tail = NULL;
	} else {
	    queue->queue_head = queue->queue_head->next;
	}
	free(tmp);
    }
}